

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynlib_unix.cpp
# Opt level: O3

PTESTFUNC __thiscall trun::DynLibLinux::FindExportedSymbol(DynLibLinux *this,string *symbolName)

{
  pointer pcVar1;
  size_t __len2;
  PTESTFUNC p_Var2;
  char *__s;
  string exportName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  pcVar1 = (symbolName->_M_dataplus)._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + symbolName->_M_string_length);
  if (*local_48._M_dataplus._M_p == '_') {
    __s = local_48._M_dataplus._M_p + 1;
    __len2 = strlen(__s);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&local_48,0,local_48._M_string_length,__s,__len2);
  }
  p_Var2 = (PTESTFUNC)dlsym(this->handle,local_48._M_dataplus._M_p);
  if (p_Var2 == (PTESTFUNC)0x0) {
    gnilk::Log::Debug<char_const*,char_const*>
              (this->pLogger,"FindExportedSymbol, unable to find symbol \'%s\'",
               local_48._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return p_Var2;
}

Assistant:

PTESTFUNC DynLibLinux::FindExportedSymbol(const std::string &symbolName) {
  
    std::string exportName = symbolName;
    if (exportName[0] == '_') {
        exportName = &exportName[1];
    }

    void *ptrInvoke = dlsym(handle, exportName.c_str());
    if (ptrInvoke == nullptr) {
        pLogger->Debug("FindExportedSymbol, unable to find symbol '%s'", exportName.c_str());
        return nullptr;
    }
    return (PTESTFUNC)ptrInvoke;
}